

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O0

blargg_err_t parse_header(byte_ *in,long size,file_t *out)

{
  byte_ *pbVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  header_t *h;
  file_t *in_stack_fffffffffffffff8;
  char *pcVar2;
  
  *in_RDX = in_RDI;
  in_RDX[1] = (long)in_RDI + in_RSI;
  if (in_RSI < 0x14) {
    pcVar2 = "Wrong file type for this emulator";
  }
  else if (*in_RDI == 0x4c554d455941585a) {
    pbVar1 = get_data(in_stack_fffffffffffffff8,(byte_ *)in_RDI,(int)((ulong)in_RSI >> 0x20));
    in_RDX[2] = pbVar1;
    if (in_RDX[2] == 0) {
      pcVar2 = "Missing track data";
    }
    else {
      pcVar2 = (blargg_err_t)0x0;
    }
  }
  else {
    pcVar2 = "Wrong file type for this emulator";
  }
  return pcVar2;
}

Assistant:

static blargg_err_t parse_header( byte const* in, long size, Ay_Emu::file_t* out )
{
	typedef Ay_Emu::header_t header_t;
	out->header = (header_t const*) in;
	out->end    = in + size;
	
	if ( size < Ay_Emu::header_size )
		return gme_wrong_file_type;
	
	header_t const& h = *(header_t const*) in;
	if ( memcmp( h.tag, "ZXAYEMUL", 8 ) )
		return gme_wrong_file_type;
	
	out->tracks = get_data( *out, h.track_info, (h.max_track + 1) * 4 );
	if ( !out->tracks )
		return "Missing track data";
	
	return 0;
}